

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

void __thiscall
UnicodeFullTest_equals_Test<std::pair<char8_t,_char32_t>_>::TestBody
          (UnicodeFullTest_equals_Test<std::pair<char8_t,_char32_t>_> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar2;
  bool bVar3;
  char32_t (*in_RDX) [5];
  char32_t (*extraout_RDX_00) [5];
  char32_t (*extraout_RDX_01) [5];
  char32_t (*extraout_RDX_02) [5];
  char32_t (*extraout_RDX_03) [5];
  char32_t (*extraout_RDX_04) [5];
  char32_t (*extraout_RDX_05) [5];
  char32_t (*extraout_RDX_07) [5];
  char32_t (*extraout_RDX_08) [5];
  char32_t (*extraout_RDX_09) [5];
  char32_t (*extraout_RDX_10) [5];
  char32_t (*extraout_RDX_11) [5];
  char32_t (*extraout_RDX_12) [5];
  char32_t (*extraout_RDX_14) [5];
  char32_t (*extraout_RDX_15) [5];
  char32_t (*extraout_RDX_16) [5];
  char32_t (*extraout_RDX_17) [5];
  char32_t (*extraout_RDX_18) [5];
  char32_t (*extraout_RDX_19) [5];
  char32_t (*extraout_RDX_21) [5];
  char32_t (*extraout_RDX_22) [5];
  char32_t (*extraout_RDX_23) [5];
  char32_t (*extraout_RDX_24) [5];
  char32_t (*extraout_RDX_25) [5];
  char32_t (*pacVar4) [5];
  char32_t (*extraout_RDX_26) [5];
  pointer *__ptr;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> rhs;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> rhs_00;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> rhs_01;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> rhs_02;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> rhs_03;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> lhs;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> lhs_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> lhs_01;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> lhs_02;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> lhs_03;
  size_type __dnew;
  size_type local_78;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_70;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_50;
  char local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  char32_t (*extraout_RDX) [5];
  char32_t (*extraout_RDX_06) [5];
  char32_t (*extraout_RDX_13) [5];
  char32_t (*extraout_RDX_20) [5];
  
  jessilib::string_cast<char8_t,char32_t[5]>(&local_50,(jessilib *)L"ABCD",in_RDX);
  paVar1 = &local_70.field_2;
  local_78 = 4;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  builtin_memcpy(local_70._M_dataplus._M_p,L"ABCD",0x10);
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  rhs._M_str = local_70._M_dataplus._M_p;
  rhs._M_len = local_78;
  lhs._M_str = local_50._M_dataplus._M_p;
  lhs._M_len = local_50._M_string_length;
  local_30[0] = jessilib::equals<char8_t,char32_t>(lhs,rhs);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar4 = extraout_RDX_00;
  }
  paVar2 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    pacVar4 = extraout_RDX_01;
  }
  if (local_30[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_50,local_30,
               "equals(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xb0,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar4 = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_03;
    }
    if (local_70._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_04;
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
    pacVar4 = extraout_RDX_05;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_50,(jessilib *)L"abcd",pacVar4);
  local_78 = 4;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  builtin_memcpy(local_70._M_dataplus._M_p,L"abcd",0x10);
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  rhs_00._M_str = local_70._M_dataplus._M_p;
  rhs_00._M_len = local_78;
  lhs_00._M_str = local_50._M_dataplus._M_p;
  lhs_00._M_len = local_50._M_string_length;
  local_30[0] = jessilib::equals<char8_t,char32_t>(lhs_00,rhs_00);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_06;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar4 = extraout_RDX_07;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    pacVar4 = extraout_RDX_08;
  }
  if (local_30[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_50,local_30,
               "equals(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xb2,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar4 = extraout_RDX_09;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_10;
    }
    if (local_70._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_11;
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
    pacVar4 = extraout_RDX_12;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_50,(jessilib *)L"ABCD",pacVar4);
  local_78 = 4;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  builtin_memcpy(local_70._M_dataplus._M_p,L"abcd",0x10);
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  rhs_01._M_str = local_70._M_dataplus._M_p;
  rhs_01._M_len = local_78;
  lhs_01._M_str = local_50._M_dataplus._M_p;
  lhs_01._M_len = local_50._M_string_length;
  bVar3 = jessilib::equals<char8_t,char32_t>(lhs_01,rhs_01);
  local_30[0] = !bVar3;
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar4 = extraout_RDX_14;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    pacVar4 = extraout_RDX_15;
  }
  if (local_30[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_50,local_30,
               "equals(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xb4,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar4 = extraout_RDX_16;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_17;
    }
    if (local_70._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_18;
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
    pacVar4 = extraout_RDX_19;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_50,(jessilib *)L"abcd",pacVar4);
  local_78 = 4;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  builtin_memcpy(local_70._M_dataplus._M_p,L"ABCD",0x10);
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  rhs_02._M_str = local_70._M_dataplus._M_p;
  rhs_02._M_len = local_78;
  lhs_02._M_str = local_50._M_dataplus._M_p;
  lhs_02._M_len = local_50._M_string_length;
  bVar3 = jessilib::equals<char8_t,char32_t>(lhs_02,rhs_02);
  local_30[0] = !bVar3;
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_20;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar4 = extraout_RDX_21;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    pacVar4 = extraout_RDX_22;
  }
  if (local_30[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_50,local_30,
               "equals(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xb6,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar4 = extraout_RDX_23;
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_24;
    }
    if (local_70._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_25;
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
    pacVar4 = extraout_RDX_26;
  }
  jessilib::string_cast<char8_t,char32_t[5]>(&local_50,(jessilib *)L"ABcd",pacVar4);
  local_78 = 4;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  builtin_memcpy(local_70._M_dataplus._M_p,L"abCD",0x10);
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  rhs_03._M_str = local_70._M_dataplus._M_p;
  rhs_03._M_len = local_78;
  lhs_03._M_str = local_50._M_dataplus._M_p;
  lhs_03._M_len = local_50._M_string_length;
  bVar3 = jessilib::equals<char8_t,char32_t>(lhs_03,rhs_03);
  local_30[0] = !bVar3;
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_50,local_30,
               "equals(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCD\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xb8,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_70._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
    }
    if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_28,local_28);
    }
  }
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, equals) {
	// TypeParam::first_type == TypeParam::second_type
	EXPECT_TRUE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_FALSE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));
}